

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcCore.c
# Opt level: O1

void Bdc_ManDecPrint(Bdc_Man_t *p)

{
  Bdc_Fun_t *pBVar1;
  Bdc_Fun_t *pNode;
  char *pcVar2;
  
  pNode = (Bdc_Fun_t *)((ulong)p->pRoot & 0xfffffffffffffffe);
  printf("F = ");
  pBVar1 = p->pRoot;
  if (pNode->Type == 2) {
    pcVar2 = "!";
    if (((ulong)pBVar1 & 1) == 0) {
      pcVar2 = "";
    }
    printf("%s%d",pcVar2,
           (ulong)((int)((ulong)((long)pNode - (long)p->pNodes) >> 3) * -0x49249249 - 1));
  }
  else if (pNode->Type == 1) {
    printf("Constant %d",(ulong)(~(uint)pBVar1 & 1));
  }
  else {
    if (((ulong)pBVar1 & 1) != 0) {
      printf("!(");
    }
    Bdc_ManDecPrint_rec(p,pNode);
    if (((ulong)p->pRoot & 1) != 0) {
      putchar(0x29);
    }
  }
  putchar(10);
  return;
}

Assistant:

void Bdc_ManDecPrint( Bdc_Man_t * p )
{
    Bdc_Fun_t * pRoot = Bdc_Regular(p->pRoot);

    printf( "F = " );
    if ( pRoot->Type == BDC_TYPE_CONST1 ) // constant 0
        printf( "Constant %d", !Bdc_IsComplement(p->pRoot) );
    else if ( pRoot->Type == BDC_TYPE_PI ) // literal
        printf( "%s%d", Bdc_IsComplement(p->pRoot) ? "!" : "", Bdc_FunId(p,pRoot)-1 );
    else
    {
        if ( Bdc_IsComplement(p->pRoot) )
            printf( "!(" );
        Bdc_ManDecPrint_rec( p, pRoot );
        if ( Bdc_IsComplement(p->pRoot) )
            printf( ")" );
    }
    printf( "\n" );
}